

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_reset_dirty_range_locked
               (uc_struct_conflict15 *uc,CPUTLBEntry *tlb_entry,uintptr_t start,uintptr_t length)

{
  uc_mode uVar1;
  
  uVar1 = uc->mode;
  if (((uVar1 & 0x3900) == UC_MODE_ARM) &&
     (((ulong)(uVar1 & 0xffffc000) - (long)tlb_entry) + (long)(uc->address_space_memory).root <
      start)) {
    uc->mode = uVar1 | 0x1000;
    return;
  }
  return;
}

Assistant:

static void tlb_reset_dirty_range_locked(struct uc_struct *uc, CPUTLBEntry *tlb_entry,
                                         uintptr_t start, uintptr_t length)
{
    uintptr_t addr = tlb_entry->addr_write;

    if ((addr & (TLB_INVALID_MASK | TLB_MMIO |
                 TLB_DISCARD_WRITE | TLB_NOTDIRTY)) == 0) {
        addr &= TARGET_PAGE_MASK;
        addr += tlb_entry->addend;
        if ((addr - start) < length) {
#if TCG_OVERSIZED_GUEST
            tlb_entry->addr_write |= TLB_NOTDIRTY;
#else
            tlb_entry->addr_write = tlb_entry->addr_write | TLB_NOTDIRTY;
#endif
        }
    }
}